

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_error qpdf_next_warning(qpdf_data qpdf)

{
  QPDF_BOOL QVar1;
  _qpdf_error *this;
  undefined1 auStack_28 [16];
  
  QVar1 = qpdf_more_warnings(qpdf);
  if (QVar1 == 0) {
    this = (_qpdf_error *)0x0;
  }
  else {
    std::make_shared<QPDFExc,QPDFExc&>((QPDFExc *)auStack_28);
    this = &qpdf->tmp_error;
    std::__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2> *)auStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_28 + 8));
    std::__cxx11::list<QPDFExc,_std::allocator<QPDFExc>_>::pop_front(&qpdf->warnings);
  }
  return this;
}

Assistant:

qpdf_error
qpdf_next_warning(qpdf_data qpdf)
{
    if (qpdf_more_warnings(qpdf)) {
        qpdf->tmp_error.exc = std::make_shared<QPDFExc>(qpdf->warnings.front());
        qpdf->warnings.pop_front();
        QTC::TC("qpdf", "qpdf-c qpdf_next_warning returned warning");
        return &qpdf->tmp_error;
    } else {
        return nullptr;
    }
}